

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInformation.cxx
# Opt level: O1

void __thiscall
cmsys::SystemInformationImplementation::RunCPUCheck(SystemInformationImplementation *this)

{
  int *piVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  char *pcVar3;
  double dVar4;
  _Alloc_hider _Var5;
  bool bVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  FILE *__stream;
  long lVar10;
  ulonglong uVar11;
  long *plVar12;
  long *plVar13;
  ulong uVar14;
  char cVar15;
  float fVar16;
  string sStack_378;
  undefined1 *puStack_358;
  long lStack_350;
  undefined1 uStack_348;
  undefined7 uStack_347;
  char **ppcStack_338;
  iterator iStack_330;
  char **ppcStack_328;
  string sStack_318;
  string sStack_2f8;
  string sStack_2d8;
  string sStack_2b8;
  long *plStack_298;
  long lStack_290;
  long lStack_288;
  long lStack_280;
  FILE *pFStack_278;
  string sStack_270;
  string sStack_250;
  string sStack_230;
  string sStack_210;
  string sStack_1f0;
  string sStack_1d0;
  string sStack_1b0;
  string sStack_190;
  string sStack_170;
  string sStack_150;
  string sStack_130;
  string sStack_110;
  string sStack_f0;
  string sStack_d0;
  string sStack_b0;
  string sStack_90;
  string sStack_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_50;
  
  this->NumberOfLogicalCPU = 0;
  this->NumberOfPhysicalCPU = 0;
  puStack_358 = &uStack_348;
  lStack_350 = 0;
  uStack_348 = 0;
  __stream = fopen64("/proc/cpuinfo","r");
  if (__stream == (FILE *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Problem opening /proc/cpuinfo",0x1d);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x18');
    std::ostream::put('\x18');
    std::ostream::flush();
    goto LAB_0012ff0e;
  }
  iVar7 = feof(__stream);
  cVar15 = -2;
  if (iVar7 == 0) {
    do {
      fgetc(__stream);
      std::__cxx11::string::push_back((char)&puStack_358);
      iVar7 = feof(__stream);
      cVar15 = cVar15 + '\x01';
    } while (iVar7 == 0);
  }
  fclose(__stream);
  std::__cxx11::string::resize((ulong)&puStack_358,cVar15);
  lVar10 = std::__cxx11::string::find((char *)&puStack_358,0x13b007,0);
  if (lVar10 != -1) {
    do {
      this->NumberOfLogicalCPU = this->NumberOfLogicalCPU + 1;
      lVar10 = std::__cxx11::string::find((char *)&puStack_358,0x13b007,lVar10 + 1);
    } while (lVar10 != -1);
  }
  sStack_90._M_dataplus._M_p = (pointer)&sStack_90.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&sStack_90,puStack_358,puStack_358 + lStack_350);
  ExtractValueFromCpuInfoFile(&sStack_70,this,&sStack_90,"physical id",0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_90._M_dataplus._M_p != &sStack_90.field_2) {
    operator_delete(sStack_90._M_dataplus._M_p,sStack_90.field_2._M_allocated_capacity + 1);
  }
  pFStack_278 = __stream;
  if (this->CurrentPositionInFile == 0xffffffffffffffff) {
    iVar7 = -1;
  }
  else {
    iVar7 = -1;
    do {
      iVar8 = atoi(sStack_70._M_dataplus._M_p);
      if (iVar7 < iVar8) {
        iVar7 = iVar8;
      }
      sStack_b0._M_dataplus._M_p = (pointer)&sStack_b0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&sStack_b0,puStack_358,puStack_358 + lStack_350);
      ExtractValueFromCpuInfoFile
                (&sStack_2b8,this,&sStack_b0,"physical id",this->CurrentPositionInFile + 1);
      std::__cxx11::string::operator=((string *)&sStack_70,(string *)&sStack_2b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)sStack_2b8._M_dataplus._M_p != &sStack_2b8.field_2) {
        operator_delete(sStack_2b8._M_dataplus._M_p,sStack_2b8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)sStack_b0._M_dataplus._M_p != &sStack_b0.field_2) {
        operator_delete(sStack_b0._M_dataplus._M_p,sStack_b0.field_2._M_allocated_capacity + 1);
      }
    } while (this->CurrentPositionInFile != 0xffffffffffffffff);
  }
  sStack_d0._M_dataplus._M_p = (pointer)&sStack_d0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&sStack_d0,puStack_358,puStack_358 + lStack_350);
  ExtractValueFromCpuInfoFile(&sStack_2b8,this,&sStack_d0,"cpu cores",0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_d0._M_dataplus._M_p != &sStack_d0.field_2) {
    operator_delete(sStack_d0._M_dataplus._M_p,sStack_d0.field_2._M_allocated_capacity + 1);
  }
  if (iVar7 < 1) {
    sStack_f0._M_dataplus._M_p = (pointer)&sStack_f0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&sStack_f0,puStack_358,puStack_358 + lStack_350);
    ExtractValueFromCpuInfoFile(&sStack_2d8,this,&sStack_f0,"ncpus active",0);
    _Var5._M_p = sStack_2d8._M_dataplus._M_p;
    uVar9 = atoi(sStack_2d8._M_dataplus._M_p);
    this->NumberOfPhysicalCPU = uVar9;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var5._M_p != &sStack_2d8.field_2) {
      operator_delete(_Var5._M_p,sStack_2d8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_f0._M_dataplus._M_p != &sStack_f0.field_2) {
      operator_delete(sStack_f0._M_dataplus._M_p,sStack_f0.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    iVar8 = atoi(sStack_2b8._M_dataplus._M_p);
    this->NumberOfPhysicalCPU = (iVar7 + 1) * iVar8;
  }
  if (this->NumberOfPhysicalCPU == 0) {
    this->NumberOfPhysicalCPU = 1;
  }
  (this->Features).ExtendedFeatures.LogicalProcessorsPerPhysical =
       this->NumberOfLogicalCPU / this->NumberOfPhysicalCPU;
  sStack_110._M_dataplus._M_p = (pointer)&sStack_110.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&sStack_110,puStack_358,puStack_358 + lStack_350);
  ExtractValueFromCpuInfoFile(&sStack_2d8,this,&sStack_110,"cpu MHz",0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_110._M_dataplus._M_p != &sStack_110.field_2) {
    operator_delete(sStack_110._M_dataplus._M_p,sStack_110.field_2._M_allocated_capacity + 1);
  }
  if (sStack_2d8._M_string_length == 0) {
    sStack_130._M_dataplus._M_p = (pointer)&sStack_130.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&sStack_130,puStack_358,puStack_358 + lStack_350);
    ExtractValueFromCpuInfoFile(&sStack_2f8,this,&sStack_130,"Cpu0ClkTck",0);
    std::__cxx11::string::operator=((string *)&sStack_2d8,(string *)&sStack_2f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_2f8._M_dataplus._M_p != &sStack_2f8.field_2) {
      operator_delete(sStack_2f8._M_dataplus._M_p,sStack_2f8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_130._M_dataplus._M_p != &sStack_130.field_2) {
      operator_delete(sStack_130._M_dataplus._M_p,sStack_130.field_2._M_allocated_capacity + 1);
    }
    uVar11 = strtoull(sStack_2d8._M_dataplus._M_p,(char **)0x0,0x10);
    fVar16 = (float)uVar11 / 1e+06;
  }
  else {
    dVar4 = atof(sStack_2d8._M_dataplus._M_p);
    fVar16 = (float)dVar4;
  }
  this->CPUSpeedInMHz = fVar16;
  sStack_150._M_dataplus._M_p = (pointer)&sStack_150.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&sStack_150,puStack_358,puStack_358 + lStack_350);
  ExtractValueFromCpuInfoFile(&sStack_2f8,this,&sStack_150,"cpu family",0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_150._M_dataplus._M_p != &sStack_150.field_2) {
    operator_delete(sStack_150._M_dataplus._M_p,sStack_150.field_2._M_allocated_capacity + 1);
  }
  if (sStack_2f8._M_string_length == 0) {
    sStack_170._M_dataplus._M_p = (pointer)&sStack_170.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&sStack_170,puStack_358,puStack_358 + lStack_350);
    ExtractValueFromCpuInfoFile(&sStack_318,this,&sStack_170,"CPU architecture",0);
    std::__cxx11::string::operator=((string *)&sStack_2f8,(string *)&sStack_318);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_318._M_dataplus._M_p != &sStack_318.field_2) {
      operator_delete(sStack_318._M_dataplus._M_p,sStack_318.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_170._M_dataplus._M_p != &sStack_170.field_2) {
      operator_delete(sStack_170._M_dataplus._M_p,sStack_170.field_2._M_allocated_capacity + 1);
    }
  }
  iVar7 = atoi(sStack_2f8._M_dataplus._M_p);
  (this->ChipID).Family = iVar7;
  sStack_190._M_dataplus._M_p = (pointer)&sStack_190.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&sStack_190,puStack_358,puStack_358 + lStack_350);
  ExtractValueFromCpuInfoFile(&sStack_318,this,&sStack_190,"vendor_id",0);
  std::__cxx11::string::operator=((string *)&(this->ChipID).Vendor,(string *)&sStack_318);
  paVar2 = &sStack_318.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_318._M_dataplus._M_p != paVar2) {
    operator_delete(sStack_318._M_dataplus._M_p,sStack_318.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_190._M_dataplus._M_p != &sStack_190.field_2) {
    operator_delete(sStack_190._M_dataplus._M_p,sStack_190.field_2._M_allocated_capacity + 1);
  }
  FindManufacturer(this,&sStack_2f8);
  if (((this->ChipID).Family == 0) && (this->ChipManufacturer == HP)) {
    iVar7 = std::__cxx11::string::compare((char *)&sStack_2f8);
    if (iVar7 == 0) {
      iVar7 = 0x11a;
    }
    else {
      iVar7 = std::__cxx11::string::compare((char *)&sStack_2f8);
      if (iVar7 != 0) goto LAB_0012f701;
      iVar7 = 0x200;
    }
    (this->ChipID).Family = iVar7;
  }
LAB_0012f701:
  sStack_1b0._M_dataplus._M_p = (pointer)&sStack_1b0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&sStack_1b0,puStack_358,puStack_358 + lStack_350);
  ExtractValueFromCpuInfoFile(&sStack_318,this,&sStack_1b0,"model",0);
  _Var5._M_p = sStack_318._M_dataplus._M_p;
  iVar7 = atoi(sStack_318._M_dataplus._M_p);
  (this->ChipID).Model = iVar7;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var5._M_p != paVar2) {
    operator_delete(_Var5._M_p,sStack_318.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_1b0._M_dataplus._M_p != &sStack_1b0.field_2) {
    operator_delete(sStack_1b0._M_dataplus._M_p,sStack_1b0.field_2._M_allocated_capacity + 1);
  }
  bVar6 = RetrieveClassicalCPUIdentity(this);
  if (!bVar6) {
    sStack_1d0._M_dataplus._M_p = (pointer)&sStack_1d0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&sStack_1d0,puStack_358,puStack_358 + lStack_350);
    ExtractValueFromCpuInfoFile(&sStack_318,this,&sStack_1d0,"cpu",0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_1d0._M_dataplus._M_p != &sStack_1d0.field_2) {
      operator_delete(sStack_1d0._M_dataplus._M_p,sStack_1d0.field_2._M_allocated_capacity + 1);
    }
    if (sStack_318._M_string_length != 0) {
      std::__cxx11::string::_M_assign((string *)&(this->ChipID).ProcessorName);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_318._M_dataplus._M_p != paVar2) {
      operator_delete(sStack_318._M_dataplus._M_p,sStack_318.field_2._M_allocated_capacity + 1);
    }
  }
  sStack_1f0._M_dataplus._M_p = (pointer)&sStack_1f0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&sStack_1f0,puStack_358,puStack_358 + lStack_350);
  ExtractValueFromCpuInfoFile(&sStack_318,this,&sStack_1f0,"stepping",0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_1f0._M_dataplus._M_p != &sStack_1f0.field_2) {
    operator_delete(sStack_1f0._M_dataplus._M_p,sStack_1f0.field_2._M_allocated_capacity + 1);
  }
  if (sStack_318._M_string_length == 0) {
    sStack_210._M_dataplus._M_p = (pointer)&sStack_210.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&sStack_210,puStack_358,puStack_358 + lStack_350);
    ExtractValueFromCpuInfoFile(&sStack_378,this,&sStack_210,"CPU revision",0);
    std::__cxx11::string::operator=((string *)&sStack_318,(string *)&sStack_378);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_378._M_dataplus._M_p != &sStack_378.field_2) {
      operator_delete(sStack_378._M_dataplus._M_p,sStack_378.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_210._M_dataplus._M_p != &sStack_210.field_2) {
      operator_delete(sStack_210._M_dataplus._M_p,sStack_210.field_2._M_allocated_capacity + 1);
    }
  }
  iVar7 = atoi(sStack_318._M_dataplus._M_p);
  (this->ChipID).Revision = iVar7;
  sStack_230._M_dataplus._M_p = (pointer)&sStack_230.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&sStack_230,puStack_358,puStack_358 + lStack_350);
  ExtractValueFromCpuInfoFile(&sStack_378,this,&sStack_230,"model name",0);
  _Var5._M_p = sStack_378._M_dataplus._M_p;
  pcVar3 = (char *)(this->ChipID).ModelName._M_string_length;
  strlen(sStack_378._M_dataplus._M_p);
  std::__cxx11::string::_M_replace((ulong)&(this->ChipID).ModelName,0,pcVar3,(ulong)_Var5._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_378._M_dataplus._M_p != &sStack_378.field_2) {
    operator_delete(sStack_378._M_dataplus._M_p,sStack_378.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_230._M_dataplus._M_p != &sStack_230.field_2) {
    operator_delete(sStack_230._M_dataplus._M_p,sStack_230.field_2._M_allocated_capacity + 1);
  }
  ppcStack_338 = (char **)0x0;
  ppcStack_328 = (char **)0x0;
  iStack_330._M_current = (char **)0x0;
  sStack_378._M_dataplus._M_p = "cache size";
  std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&ppcStack_338,(iterator)0x0,
             (char **)&sStack_378);
  sStack_378._M_dataplus._M_p = "I-cache";
  if (iStack_330._M_current == ppcStack_328) {
    std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
              ((vector<char_const*,std::allocator<char_const*>> *)&ppcStack_338,iStack_330,
               (char **)&sStack_378);
  }
  else {
    *iStack_330._M_current = "I-cache";
    iStack_330._M_current = iStack_330._M_current + 1;
  }
  sStack_378._M_dataplus._M_p = "D-cache";
  if (iStack_330._M_current == ppcStack_328) {
    std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
              ((vector<char_const*,std::allocator<char_const*>> *)&ppcStack_338,iStack_330,
               (char **)&sStack_378);
  }
  else {
    *iStack_330._M_current = "D-cache";
    iStack_330._M_current = iStack_330._M_current + 1;
  }
  (this->Features).L1CacheSize = 0;
  if (iStack_330._M_current != ppcStack_338) {
    uVar14 = 0;
    do {
      sStack_250._M_dataplus._M_p = (pointer)&sStack_250.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&sStack_250,puStack_358,puStack_358 + lStack_350);
      ExtractValueFromCpuInfoFile(&sStack_378,this,&sStack_250,ppcStack_338[uVar14],0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)sStack_250._M_dataplus._M_p != &sStack_250.field_2) {
        operator_delete(sStack_250._M_dataplus._M_p,sStack_250.field_2._M_allocated_capacity + 1);
      }
      if (sStack_378._M_string_length != 0) {
        lVar10 = std::__cxx11::string::find((char *)&sStack_378,0x13b0cd,0);
        if (lVar10 != -1) {
          std::__cxx11::string::substr((ulong)&plStack_298,(ulong)&sStack_378);
          std::__cxx11::string::operator=((string *)&sStack_378,(string *)&plStack_298);
          if (plStack_298 != &lStack_288) {
            operator_delete(plStack_298,lStack_288 + 1);
          }
        }
        iVar7 = atoi(sStack_378._M_dataplus._M_p);
        piVar1 = &(this->Features).L1CacheSize;
        *piVar1 = *piVar1 + iVar7;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)sStack_378._M_dataplus._M_p != &sStack_378.field_2) {
        operator_delete(sStack_378._M_dataplus._M_p,sStack_378.field_2._M_allocated_capacity + 1);
      }
      uVar14 = uVar14 + 1;
    } while (uVar14 < (ulong)((long)iStack_330._M_current - (long)ppcStack_338 >> 3));
  }
  sStack_270._M_dataplus._M_p = (pointer)&sStack_270.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&sStack_270,puStack_358,puStack_358 + lStack_350);
  ExtractValueFromCpuInfoFile(&sStack_378,this,&sStack_270,"flags",0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_270._M_dataplus._M_p != &sStack_270.field_2) {
    operator_delete(sStack_270._M_dataplus._M_p,sStack_270.field_2._M_allocated_capacity + 1);
  }
  if (sStack_318._M_string_length != 0) {
    std::operator+(&bStack_50," ",&sStack_378);
    plVar12 = (long *)std::__cxx11::string::append((char *)&bStack_50);
    plVar13 = plVar12 + 2;
    if ((long *)*plVar12 == plVar13) {
      lStack_288 = *plVar13;
      lStack_280 = plVar12[3];
      plStack_298 = &lStack_288;
    }
    else {
      lStack_288 = *plVar13;
      plStack_298 = (long *)*plVar12;
    }
    lStack_290 = plVar12[1];
    *plVar12 = (long)plVar13;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    std::__cxx11::string::operator=((string *)&sStack_378,(string *)&plStack_298);
    if (plStack_298 != &lStack_288) {
      operator_delete(plStack_298,lStack_288 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)bStack_50._M_dataplus._M_p != &bStack_50.field_2) {
      operator_delete(bStack_50._M_dataplus._M_p,bStack_50.field_2._M_allocated_capacity + 1);
    }
    lVar10 = std::__cxx11::string::find((char *)&sStack_378,0x13b0d7,0);
    if (lVar10 != -1) {
      (this->Features).HasFPU = true;
    }
    lVar10 = std::__cxx11::string::find((char *)&sStack_378,0x13b0dd,0);
    if (lVar10 != -1) {
      (this->Features).HasTSC = true;
    }
    lVar10 = std::__cxx11::string::find((char *)&sStack_378,0x13b0e3,0);
    if (lVar10 != -1) {
      (this->Features).HasMMX = true;
    }
    lVar10 = std::__cxx11::string::find((char *)&sStack_378,0x13b0e9,0);
    if (lVar10 != -1) {
      (this->Features).HasSSE = true;
    }
    lVar10 = std::__cxx11::string::find((char *)&sStack_378,0x13b0ef,0);
    if (lVar10 != -1) {
      (this->Features).HasSSE2 = true;
    }
    lVar10 = std::__cxx11::string::find((char *)&sStack_378,0x13b0f6,0);
    if (lVar10 != -1) {
      (this->Features).HasAPIC = true;
    }
    lVar10 = std::__cxx11::string::find((char *)&sStack_378,0x13b0fd,0);
    if (lVar10 != -1) {
      (this->Features).HasCMOV = true;
    }
    lVar10 = std::__cxx11::string::find((char *)&sStack_378,0x13b104,0);
    if (lVar10 != -1) {
      (this->Features).HasMTRR = true;
    }
    lVar10 = std::__cxx11::string::find((char *)&sStack_378,0x13b10b,0);
    if (lVar10 != -1) {
      (this->Features).HasACPI = true;
    }
    lVar10 = std::__cxx11::string::find((char *)&sStack_378,0x13b112,0);
    if (lVar10 != -1) {
      (this->Features).ExtendedFeatures.Has3DNow = true;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_378._M_dataplus._M_p != &sStack_378.field_2) {
    operator_delete(sStack_378._M_dataplus._M_p,sStack_378.field_2._M_allocated_capacity + 1);
  }
  if (ppcStack_338 != (char **)0x0) {
    operator_delete(ppcStack_338,(long)ppcStack_328 - (long)ppcStack_338);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_318._M_dataplus._M_p != &sStack_318.field_2) {
    operator_delete(sStack_318._M_dataplus._M_p,sStack_318.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_2f8._M_dataplus._M_p != &sStack_2f8.field_2) {
    operator_delete(sStack_2f8._M_dataplus._M_p,sStack_2f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_2d8._M_dataplus._M_p != &sStack_2d8.field_2) {
    operator_delete(sStack_2d8._M_dataplus._M_p,sStack_2d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_2b8._M_dataplus._M_p != &sStack_2b8.field_2) {
    operator_delete(sStack_2b8._M_dataplus._M_p,sStack_2b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_70._M_dataplus._M_p != &sStack_70.field_2) {
    operator_delete(sStack_70._M_dataplus._M_p,sStack_70.field_2._M_allocated_capacity + 1);
  }
LAB_0012ff0e:
  if (puStack_358 != &uStack_348) {
    operator_delete(puStack_358,CONCAT71(uStack_347,uStack_348) + 1);
  }
  return;
}

Assistant:

void SystemInformationImplementation::RunCPUCheck()
{
#ifdef WIN32
  // Check to see if this processor supports CPUID.
  bool supportsCPUID = DoesCPUSupportCPUID();

  if (supportsCPUID)
    {
    // Retrieve the CPU details.
    RetrieveCPUIdentity();
    this->FindManufacturer();
    RetrieveCPUFeatures();
    }

  // These two may be called without support for the CPUID instruction.
  // (But if the instruction is there, they should be called *after*
  // the above call to RetrieveCPUIdentity... that's why the two if
  // blocks exist with the same "if (supportsCPUID)" logic...
  //
  if (!RetrieveCPUClockSpeed())
    {
    RetrieveClassicalCPUClockSpeed();
    }

  if (supportsCPUID)
    {
    // Retrieve cache information.
    if (!RetrieveCPUCacheDetails())
      {
      RetrieveClassicalCPUCacheDetails();
      }

    // Retrieve the extended CPU details.
    if (!RetrieveExtendedCPUIdentity())
      {
      RetrieveClassicalCPUIdentity();
      }

    RetrieveExtendedCPUFeatures();
    RetrieveCPUPowerManagement();

    // Now attempt to retrieve the serial number (if possible).
    RetrieveProcessorSerialNumber();
    }

  this->CPUCount();

#elif defined(__APPLE__)
  this->ParseSysCtl();
#elif defined (__SVR4) && defined (__sun)
  this->QuerySolarisProcessor();
#elif defined(__HAIKU__)
  this->QueryHaikuInfo();
#elif defined(__QNX__)
  this->QueryQNXProcessor();
#elif defined(__OpenBSD__) || defined(__FreeBSD__) || defined(__NetBSD__) || defined(__DragonFly__)
  this->QueryBSDProcessor();
#elif defined(__hpux)
  this->QueryHPUXProcessor();
#elif defined(__linux) || defined(__CYGWIN__)
  this->RetreiveInformationFromCpuInfoFile();
#else
  this->QueryProcessor();
#endif
}